

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::GetCurrentNetwork
          (PersistentStorageJson *this,NetworkId *aNwkId)

{
  bool bVar1;
  NetworkId NVar2;
  reference pvVar3;
  json *this_00;
  NetworkId local_2c;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  
  this_00 = &this->mCache;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          contains<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                    (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             JSON_CURR_NWK_abi_cxx11_);
  if (bVar1) {
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    NVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<ot::commissioner::persistent_storage::NetworkId,_ot::commissioner::persistent_storage::NetworkId,_0>
                      (pvVar3);
    aNwkId->mId = (uint)NVar2;
  }
  else {
    NetworkId::NetworkId(&local_2c);
    aNwkId->mId = (uint)local_2c;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<ot::commissioner::persistent_storage::NetworkId_&,_ot::commissioner::persistent_storage::NetworkId,_0>
              (&local_28,aNwkId);
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](this_00,(key_type *)JSON_CURR_NWK_abi_cxx11_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(pvVar3,&local_28);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_28);
  }
  return kSuccess;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::GetCurrentNetwork(NetworkId &aNwkId)
{
    if (!mCache.contains(JSON_CURR_NWK))
    {
        aNwkId                = NetworkId{};
        mCache[JSON_CURR_NWK] = aNwkId;
    }
    else
    {
        aNwkId = mCache[JSON_CURR_NWK];
    }
    return PersistentStorage::Status::kSuccess;
}